

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::delegateSizeHintChanged(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  ContextType *object;
  char cVar1;
  long in_FS_OFFSET;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  object = *(ContextType **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  if (this->model != (QAbstractItemModel *)0x0) {
    cVar1 = QAbstractItemModel::checkIndex(this->model,index,0);
    if (cVar1 == '\0') {
      local_30._0_4_ = 2;
      local_1c = 0;
      local_30._4_4_ = 0;
      uStack_28 = 0;
      uStack_24 = 0;
      uStack_20 = 0;
      local_18 = "default";
      QMessageLogger::warning
                ((char *)&local_30,
                 "Delegate size hint changed for a model index that does not belong to this view");
    }
  }
  local_30._0_4_ = 0x221;
  local_30._4_4_ = 0;
  uStack_28 = 0;
  uStack_24 = 0;
  QMetaObject::invokeMethod<void(QAbstractItemView::*)()>(object,&local_30,QueuedConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::delegateSizeHintChanged(const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    if (model) {
        if (!model->checkIndex(index))
            qWarning("Delegate size hint changed for a model index that does not belong to this view");
    }
    QMetaObject::invokeMethod(q, &QAbstractItemView::doItemsLayout, Qt::QueuedConnection);
}